

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void color_esycc_to_rgb(opj_image_t *image)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int max_value;
  int flip_value;
  uint i;
  uint max;
  uint h;
  uint w;
  int val;
  int sign2;
  int sign1;
  int cr;
  int cb;
  int y;
  opj_image_t *image_local;
  
  iVar6 = 1 << ((char)image->comps->prec - 1U & 0x1f);
  uVar7 = (1 << ((byte)image->comps->prec & 0x1f)) - 1;
  if ((((image->numcomps < 3) || (image->comps->dx != image->comps[1].dx)) ||
      (image->comps->dx != image->comps[2].dx)) ||
     ((image->comps->dy != image->comps[1].dy || (image->comps->dy != image->comps[2].dy)))) {
    fprintf(_stderr,"%s:%d:color_esycc_to_rgb\n\tCAN NOT CONVERT\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/bin/common/color.c"
            ,0x435);
  }
  else {
    OVar1 = image->comps->w;
    OVar2 = image->comps->h;
    OVar3 = image->comps[1].sgnd;
    OVar4 = image->comps[2].sgnd;
    for (max_value = 0; (uint)max_value < OVar1 * OVar2; max_value = max_value + 1) {
      iVar5 = image->comps->data[(uint)max_value];
      sign1 = image->comps[1].data[(uint)max_value];
      sign2 = image->comps[2].data[(uint)max_value];
      if (OVar3 == 0) {
        sign1 = sign1 - iVar6;
      }
      if (OVar4 == 0) {
        sign2 = sign2 - iVar6;
      }
      uVar8 = (uint)((float)sign2 * 1.40199 + (float)sign1 * -3.68e-05 + (float)iVar5 + 0.5);
      h = uVar7;
      if (((int)uVar8 <= (int)uVar7) && (h = uVar8, (int)uVar8 < 0)) {
        h = 0;
      }
      image->comps->data[(uint)max_value] = h;
      uVar8 = (uint)((float)sign2 * -0.7141128 + (float)iVar5 * 1.0003 + -((float)sign1 * 0.344125)
                    + 0.5);
      h = uVar7;
      if (((int)uVar8 <= (int)uVar7) && (h = uVar8, (int)uVar8 < 0)) {
        h = 0;
      }
      image->comps[1].data[(uint)max_value] = h;
      uVar8 = (uint)((float)sign2 * -8e-06 + (float)iVar5 * 0.999823 + (float)sign1 * 1.77204 + 0.5)
      ;
      h = uVar7;
      if (((int)uVar8 <= (int)uVar7) && (h = uVar8, (int)uVar8 < 0)) {
        h = 0;
      }
      image->comps[2].data[(uint)max_value] = h;
    }
    image->color_space = OPJ_CLRSPC_SRGB;
  }
  return;
}

Assistant:

void color_esycc_to_rgb(opj_image_t *image)
{
    int y, cb, cr, sign1, sign2, val;
    unsigned int w, h, max, i;
    int flip_value = (1 << (image->comps[0].prec - 1));
    int max_value = (1 << image->comps[0].prec) - 1;

    if (
        (image->numcomps < 3)
        || (image->comps[0].dx != image->comps[1].dx) ||
        (image->comps[0].dx != image->comps[2].dx)
        || (image->comps[0].dy != image->comps[1].dy) ||
        (image->comps[0].dy != image->comps[2].dy)
    ) {
        fprintf(stderr, "%s:%d:color_esycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }

    w = image->comps[0].w;
    h = image->comps[0].h;

    sign1 = (int)image->comps[1].sgnd;
    sign2 = (int)image->comps[2].sgnd;

    max = w * h;

    for (i = 0; i < max; ++i) {

        y = image->comps[0].data[i];
        cb = image->comps[1].data[i];
        cr = image->comps[2].data[i];

        if (!sign1) {
            cb -= flip_value;
        }
        if (!sign2) {
            cr -= flip_value;
        }

        val = (int)
              ((float)y - (float)0.0000368 * (float)cb
               + (float)1.40199 * (float)cr + (float)0.5);

        if (val > max_value) {
            val = max_value;
        } else if (val < 0) {
            val = 0;
        }
        image->comps[0].data[i] = val;

        val = (int)
              ((float)1.0003 * (float)y - (float)0.344125 * (float)cb
               - (float)0.7141128 * (float)cr + (float)0.5);

        if (val > max_value) {
            val = max_value;
        } else if (val < 0) {
            val = 0;
        }
        image->comps[1].data[i] = val;

        val = (int)
              ((float)0.999823 * (float)y + (float)1.77204 * (float)cb
               - (float)0.000008 * (float)cr + (float)0.5);

        if (val > max_value) {
            val = max_value;
        } else if (val < 0) {
            val = 0;
        }
        image->comps[2].data[i] = val;
    }
    image->color_space = OPJ_CLRSPC_SRGB;

}